

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Minisat::Lit,_int> *out_clause)

{
  vec<Minisat::Lit,_int> *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Clause *local_98;
  Clause *local_90;
  Lit local_80;
  int local_7c;
  int local_78;
  Lit local_74;
  int i_1;
  int local_6c;
  Lit local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int j;
  Clause *pCStack_50;
  int i;
  Clause *qs;
  Clause *ps;
  vec<Minisat::Lit,_int> *pvStack_38;
  bool ps_smallest;
  vec<Minisat::Lit,_int> *out_clause_local;
  Clause *pCStack_28;
  Var v_local;
  Clause *_qs_local;
  Clause *_ps_local;
  SimpSolver *this_local;
  
  this->merges = this->merges + 1;
  pvStack_38 = out_clause;
  out_clause_local._4_4_ = v;
  pCStack_28 = _qs;
  _qs_local = _ps;
  _ps_local = (Clause *)this;
  vec<Minisat::Lit,_int>::clear(out_clause,false);
  iVar3 = Clause::size(_qs_local);
  iVar4 = Clause::size(pCStack_28);
  ps._7_1_ = iVar3 < iVar4;
  if ((bool)ps._7_1_) {
    local_90 = pCStack_28;
  }
  else {
    local_90 = _qs_local;
  }
  qs = local_90;
  if ((bool)ps._7_1_) {
    local_98 = _qs_local;
  }
  else {
    local_98 = pCStack_28;
  }
  pCStack_50 = local_98;
  j = 0;
  do {
    iVar3 = j;
    iVar4 = Clause::size(pCStack_50);
    if (iVar4 <= iVar3) {
      for (local_78 = 0; iVar3 = local_78, iVar4 = Clause::size(qs), iVar3 < iVar4;
          local_78 = local_78 + 1) {
        local_7c = (int)Clause::operator[](qs,local_78);
        iVar3 = var((Lit)local_7c);
        pvVar1 = pvStack_38;
        if (iVar3 != out_clause_local._4_4_) {
          local_80 = Clause::operator[](qs,local_78);
          vec<Minisat::Lit,_int>::push(pvVar1,&local_80);
        }
      }
      return true;
    }
    local_58 = (int)Clause::operator[](pCStack_50,j);
    iVar3 = var((Lit)local_58);
    if (iVar3 != out_clause_local._4_4_) {
      for (local_5c = 0; iVar3 = local_5c, iVar4 = Clause::size(qs), pvVar1 = pvStack_38,
          iVar3 < iVar4; local_5c = local_5c + 1) {
        local_60 = (int)Clause::operator[](qs,local_5c);
        iVar3 = var((Lit)local_60);
        local_64 = (int)Clause::operator[](pCStack_50,j);
        iVar4 = var((Lit)local_64);
        if (iVar3 == iVar4) {
          local_68 = Clause::operator[](qs,local_5c);
          i_1 = (int)Clause::operator[](pCStack_50,j);
          local_6c = (int)operator~((Lit)i_1);
          bVar2 = Lit::operator==(&local_68,(Lit)local_6c);
          if (bVar2) {
            return false;
          }
          goto LAB_0011f426;
        }
      }
      local_74 = Clause::operator[](pCStack_50,j);
      vec<Minisat::Lit,_int>::push(pvVar1,&local_74);
    }
LAB_0011f426:
    j = j + 1;
  } while( true );
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])){
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}